

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatBuffer.h
# Opt level: O2

void __thiscall
slang::FormatBuffer::format<std::basic_string_view<char,std::char_traits<char>>const&>
          (FormatBuffer *this,format_string<const_std::basic_string_view<char>_&> fmt,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  format_args args_00;
  char *local_18;
  size_t local_10;
  
  local_10 = args->_M_len;
  local_18 = args->_M_str;
  args_00.field_1.values_ = (value<fmt::v11::context> *)&local_18;
  args_00.desc_ = 0xd;
  ::fmt::v11::detail::vformat_to((buffer<char> *)this,fmt.str,args_00,(locale_ref)0x0);
  return;
}

Assistant:

void format(fmt::format_string<Args...> fmt, Args&&... args) {
        fmt::detail::vformat_to(buf, fmt::string_view(fmt), fmt::make_format_args(args...));
    }